

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  bool bVar1;
  FaceIndex FVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  uint in_ESI;
  long in_RDI;
  int hole_id;
  FaceIndex left_face_id;
  FaceIndex right_face_id;
  CornerIndex left_corner_id;
  CornerIndex right_corner_id;
  bool on_boundary;
  VertexIndex vert_id;
  FaceIndex face_id;
  int num_visited_faces;
  int num_faces;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *in_stack_fffffffffffffed8;
  CornerIndex in_stack_fffffffffffffee0;
  VertexIndex in_stack_fffffffffffffee4;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *in_stack_fffffffffffffee8;
  CornerIndex in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  CornerIndex in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  bool local_d1;
  reference local_c0;
  value_type local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_9c;
  uint local_98;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_94;
  uint local_90;
  ThisIndexType local_8c;
  uint local_88;
  ThisIndexType local_84;
  uint local_80;
  ThisIndexType local_7c;
  reference local_78;
  uint local_64;
  byte local_5d;
  uint local_5c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_58;
  uint local_54;
  reference local_50;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar7;
  undefined1 encode_first_vertex;
  int iVar8;
  FaceIndex in_stack_ffffffffffffffd4;
  reference local_28;
  ValueType local_14;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_4;
  
  local_4.value_ = in_ESI;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           *)0x19763c);
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
              (value_type *)in_stack_fffffffffffffee8);
  local_14 = Mesh::num_faces((Mesh *)0x197660);
  do {
    while( true ) {
      bVar1 = std::
              vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ::empty((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return true;
      }
      pvVar4 = std::
               vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ::back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_)
                     );
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4,pvVar4);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                        (&local_4,(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                  &kInvalidCornerIndex);
      local_d1 = true;
      if (!bVar1) {
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1976d9);
        in_stack_ffffffffffffffd4 =
             CornerTable::Face((CornerTable *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                  ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)&stack0xffffffffffffffd4);
        local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        local_d1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
      }
      if (local_d1 == false) break;
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::pop_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  *)0x197751);
    }
    iVar8 = 0;
    while (iVar8 < (int)local_14) {
      iVar8 = iVar8 + 1;
      *(int *)(in_RDI + 0x188) = *(int *)(in_RDI + 0x188) + 1;
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x1977a3);
      IVar7.value_ = local_4.value_;
      FVar2 = CornerTable::Face((CornerTable *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      encode_first_vertex = (undefined1)(IVar7.value_ >> 0x18);
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)&stack0xffffffffffffffc8);
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::_Bit_reference::operator=(&local_50,true);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
                  (value_type *)in_stack_fffffffffffffee8);
      local_54 = local_4.value_;
      MeshEdgebreakerTraversalEncoder::NewCornerReached
                ((MeshEdgebreakerTraversalEncoder *)(in_RDI + 0x1c0),(CornerIndex)local_4.value_);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x197861);
      local_5c = local_4.value_;
      local_58.value_ =
           (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffee8,
                                     in_stack_fffffffffffffef0);
      uVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_58);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x170),(ulong)uVar3);
      local_5d = *pvVar5 != -1;
      local_64 = local_58.value_;
      bVar1 = IsVertexVisited(in_stack_fffffffffffffed8,in_stack_fffffffffffffee4);
      if (bVar1) {
LAB_00197994:
        local_88 = local_4.value_;
        local_84.value_ = (uint)GetRightCorner(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
        local_90 = local_4.value_;
        local_8c.value_ = (uint)GetLeftCorner(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x1979ee);
        local_98 = local_84.value_;
        local_94.value_ =
             (uint)CornerTable::Face((CornerTable *)in_stack_fffffffffffffed8,
                                     in_stack_fffffffffffffee0);
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x197a20);
        local_a0 = local_8c.value_;
        local_9c.value_ =
             (uint)CornerTable::Face((CornerTable *)in_stack_fffffffffffffed8,
                                     in_stack_fffffffffffffee0);
        local_a4 = local_4.value_;
        bVar1 = IsRightFaceVisited((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>
                                    *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   in_stack_ffffffffffffff00);
        if (bVar1) {
          bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator!=
                            (&local_94,
                             (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                             &kInvalidFaceIndex);
          if (bVar1) {
            in_stack_ffffffffffffff00.value_ = *(uint *)(in_RDI + 0x188);
            in_stack_ffffffffffffff04 =
                 IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                           ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                            &stack0xffffffffffffffc8);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_94);
            CheckAndStoreTopologySplitEvent
                      ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                       in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                       (EdgeFaceName)(in_stack_fffffffffffffef4 >> 0x18),
                       in_stack_fffffffffffffef0.value_);
          }
          local_a8 = local_4.value_;
          bVar1 = IsLeftFaceVisited((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>
                                     *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                    ,in_stack_ffffffffffffff00);
          if (bVar1) {
            bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator!=
                              (&local_9c,
                               (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                               &kInvalidFaceIndex);
            if (bVar1) {
              in_stack_fffffffffffffef8 = *(int *)(in_RDI + 0x188);
              in_stack_fffffffffffffefc =
                   IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                             ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                              &stack0xffffffffffffffc8);
              IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_9c);
              CheckAndStoreTopologySplitEvent
                        ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                         in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                         (EdgeFaceName)(in_stack_fffffffffffffef4 >> 0x18),
                         in_stack_fffffffffffffef0.value_);
            }
            MeshEdgebreakerTraversalEncoder::EncodeSymbol
                      ((MeshEdgebreakerTraversalEncoder *)
                       CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_),
                       (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffed8 >> 0x20));
            std::
            vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ::pop_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        *)0x197b77);
            break;
          }
          MeshEdgebreakerTraversalEncoder::EncodeSymbol
                    ((MeshEdgebreakerTraversalEncoder *)
                     CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_),
                     (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffed8 >> 0x20));
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4,&local_8c);
        }
        else {
          local_ac = local_4.value_;
          bVar1 = IsLeftFaceVisited((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>
                                     *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                    ,in_stack_ffffffffffffff00);
          if (!bVar1) {
            MeshEdgebreakerTraversalEncoder::EncodeSymbol
                      ((MeshEdgebreakerTraversalEncoder *)
                       CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_),
                       (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffed8 >> 0x20));
            *(int *)(in_RDI + 0x18c) = *(int *)(in_RDI + 0x18c) + 1;
            if ((local_5d & 1) != 0) {
              in_stack_fffffffffffffee8 =
                   (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                   (in_RDI + 0x170);
              uVar3 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_58);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8,
                                  (ulong)uVar3);
              local_b0 = *pvVar5;
              local_c0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)
                                    CONCAT44(in_stack_ffffffffffffff04,
                                             in_stack_ffffffffffffff00.value_),
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                EncodeHole((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                           CONCAT44(iVar8,FVar2.value_),
                           (CornerIndex)in_stack_ffffffffffffffd4.value_,(bool)encode_first_vertex);
              }
            }
            in_stack_fffffffffffffee4.value_ = *(uint *)(in_RDI + 0x188);
            in_stack_fffffffffffffed8 =
                 (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                 (in_RDI + 0x110);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                      ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                       &stack0xffffffffffffffc8);
            puVar6 = (uint *)std::
                             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffee4.value_,
                                                      in_stack_fffffffffffffee0.value_),
                                          (key_type *)in_stack_fffffffffffffed8);
            *puVar6 = in_stack_fffffffffffffee4.value_;
            pvVar4 = std::
                     vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ::back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffee4.value_,
                                        in_stack_fffffffffffffee0.value_));
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(pvVar4,&local_8c);
            std::
            vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
                        (value_type *)in_stack_fffffffffffffee8);
            break;
          }
          bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator!=
                            (&local_9c,
                             (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                             &kInvalidFaceIndex);
          if (bVar1) {
            in_stack_fffffffffffffef0.value_ = *(uint *)(in_RDI + 0x188);
            in_stack_fffffffffffffef4 =
                 IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value
                           ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                            &stack0xffffffffffffffc8);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_9c);
            CheckAndStoreTopologySplitEvent
                      ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                       in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                       (EdgeFaceName)(in_stack_fffffffffffffef4 >> 0x18),
                       in_stack_fffffffffffffef0.value_);
          }
          MeshEdgebreakerTraversalEncoder::EncodeSymbol
                    ((MeshEdgebreakerTraversalEncoder *)
                     CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_),
                     (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffed8 >> 0x20));
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4,&local_84);
        }
      }
      else {
        IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_58);
        local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.value_),
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::_Bit_reference::operator=(&local_78,true);
        if ((local_5d & 1) != 0) goto LAB_00197994;
        MeshEdgebreakerTraversalEncoder::EncodeSymbol
                  ((MeshEdgebreakerTraversalEncoder *)
                   CONCAT44(in_stack_fffffffffffffee4.value_,in_stack_fffffffffffffee0.value_),
                   (EdgebreakerTopologyBitPattern)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        local_80 = local_4.value_;
        local_7c.value_ = (uint)GetRightCorner(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_4,&local_7c);
      }
    }
  } while( true );
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}